

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void highbd_blend_a64_d16_mask_w8_sse4_1
               (uint16_t *dst,int dst_stride,CONV_BUF_TYPE *src0,int src0_stride,CONV_BUF_TYPE *src1
               ,int src1_stride,__m128i *mask0a,__m128i *mask0b,__m128i *round_offset,int shift,
               __m128i *clip_low,__m128i *clip_high,__m128i *max_mask)

{
  uint16_t *puVar1;
  undefined1 auVar2 [16];
  __m128i alVar3;
  __m128i alVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  unkbyte10 Var25;
  unkbyte10 Var26;
  unkbyte10 Var27;
  int iVar28;
  int iVar29;
  int iVar30;
  ushort uVar31;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ushort uVar41;
  ushort uVar43;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  undefined1 auVar45 [16];
  ushort uVar52;
  undefined1 auVar54 [16];
  int iVar55;
  int iVar58;
  undefined1 auVar61 [16];
  undefined1 auVar62 [12];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  short sVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar71;
  short sVar32;
  short sVar42;
  short sVar44;
  short sVar53;
  undefined1 auVar56 [12];
  undefined1 auVar57 [16];
  undefined1 auVar59 [12];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar72 [12];
  undefined1 auVar73 [16];
  
  auVar34 = *(undefined1 (*) [16])src0;
  auVar45 = *(undefined1 (*) [16])(src0 + src0_stride);
  auVar61 = *(undefined1 (*) [16])src1;
  auVar2 = *(undefined1 (*) [16])(src1 + src1_stride);
  sVar67 = (short)(*max_mask)[0];
  sVar53 = *(short *)((long)*max_mask + 2);
  sVar5 = *(short *)((long)*max_mask + 4);
  sVar6 = *(short *)((long)*max_mask + 6);
  sVar7 = (short)(*max_mask)[1];
  sVar8 = *(short *)((long)*max_mask + 10);
  sVar9 = *(short *)((long)*max_mask + 0xc);
  sVar10 = *(short *)((long)*max_mask + 0xe);
  alVar3 = *mask0a;
  auVar33._0_2_ = sVar67 - (short)alVar3[0];
  auVar33._2_2_ = sVar53 - alVar3[0]._2_2_;
  auVar33._4_2_ = sVar5 - alVar3[0]._4_2_;
  auVar33._6_2_ = sVar6 - alVar3[0]._6_2_;
  auVar33._8_2_ = sVar7 - (short)alVar3[1];
  auVar33._10_2_ = sVar8 - alVar3[1]._2_2_;
  auVar33._12_2_ = sVar9 - alVar3[1]._4_2_;
  auVar33._14_2_ = sVar10 - alVar3[1]._6_2_;
  alVar4 = *mask0b;
  auVar54._0_2_ = sVar67 - (short)alVar4[0];
  auVar54._2_2_ = sVar53 - alVar4[0]._2_2_;
  auVar54._4_2_ = sVar5 - alVar4[0]._4_2_;
  auVar54._6_2_ = sVar6 - alVar4[0]._6_2_;
  auVar54._8_2_ = sVar7 - (short)alVar4[1];
  auVar54._10_2_ = sVar8 - alVar4[1]._2_2_;
  auVar54._12_2_ = sVar9 - alVar4[1]._4_2_;
  auVar54._14_2_ = sVar10 - alVar4[1]._6_2_;
  auVar68 = pmulhuw((undefined1  [16])alVar3,auVar34);
  sVar67 = alVar3[0]._6_2_ * auVar34._6_2_;
  iVar71 = CONCAT22(auVar68._8_2_,(short)alVar3[1] * auVar34._8_2_);
  auVar72._0_8_ = CONCAT26(auVar68._10_2_,CONCAT24(alVar3[1]._2_2_ * auVar34._10_2_,iVar71));
  auVar72._8_2_ = alVar3[1]._4_2_ * auVar34._12_2_;
  auVar72._10_2_ = auVar68._12_2_;
  auVar73._12_2_ = alVar3[1]._6_2_ * auVar34._14_2_;
  auVar73._0_12_ = auVar72;
  auVar73._14_2_ = auVar68._14_2_;
  iVar28 = CONCAT22(auVar68._6_2_,sVar67);
  Var25 = CONCAT64(CONCAT42(iVar28,auVar68._4_2_),CONCAT22(alVar3[0]._4_2_ * auVar34._4_2_,sVar67));
  auVar21._4_8_ = (long)((unkuint10)Var25 >> 0x10);
  auVar21._2_2_ = auVar68._2_2_;
  auVar21._0_2_ = alVar3[0]._2_2_ * auVar34._2_2_;
  auVar69 = pmulhuw(auVar33,auVar61);
  sVar67 = auVar33._6_2_ * auVar61._6_2_;
  iVar55 = CONCAT22(auVar69._8_2_,auVar33._8_2_ * auVar61._8_2_);
  auVar62._0_8_ = CONCAT26(auVar69._10_2_,CONCAT24(auVar33._10_2_ * auVar61._10_2_,iVar55));
  auVar62._8_2_ = auVar33._12_2_ * auVar61._12_2_;
  auVar62._10_2_ = auVar69._12_2_;
  auVar63._12_2_ = auVar33._14_2_ * auVar61._14_2_;
  auVar63._0_12_ = auVar62;
  auVar63._14_2_ = auVar69._14_2_;
  iVar29 = CONCAT22(auVar69._6_2_,sVar67);
  Var26 = CONCAT64(CONCAT42(iVar29,auVar69._4_2_),CONCAT22(auVar33._4_2_ * auVar61._4_2_,sVar67));
  auVar22._4_8_ = (long)((unkuint10)Var26 >> 0x10);
  auVar22._2_2_ = auVar69._2_2_;
  auVar22._0_2_ = auVar33._2_2_ * auVar61._2_2_;
  auVar65 = pmulhuw((undefined1  [16])alVar4,auVar45);
  sVar67 = alVar4[0]._6_2_ * auVar45._6_2_;
  iVar58 = CONCAT22(auVar65._8_2_,(short)alVar4[1] * auVar45._8_2_);
  auVar59._0_8_ = CONCAT26(auVar65._10_2_,CONCAT24(alVar4[1]._2_2_ * auVar45._10_2_,iVar58));
  auVar59._8_2_ = alVar4[1]._4_2_ * auVar45._12_2_;
  auVar59._10_2_ = auVar65._12_2_;
  auVar60._12_2_ = alVar4[1]._6_2_ * auVar45._14_2_;
  auVar60._0_12_ = auVar59;
  auVar60._14_2_ = auVar65._14_2_;
  iVar30 = CONCAT22(auVar65._6_2_,sVar67);
  Var27 = CONCAT64(CONCAT42(iVar30,auVar65._4_2_),CONCAT22(alVar4[0]._4_2_ * auVar45._4_2_,sVar67));
  auVar23._4_8_ = (long)((unkuint10)Var27 >> 0x10);
  auVar23._2_2_ = auVar65._2_2_;
  auVar23._0_2_ = alVar4[0]._2_2_ * auVar45._2_2_;
  auVar66 = pmulhuw(auVar54,auVar2);
  sVar67 = auVar54._6_2_ * auVar2._6_2_;
  iVar11 = (int)(*round_offset)[0];
  iVar12 = *(int *)((long)*round_offset + 4);
  iVar13 = (int)(*round_offset)[1];
  iVar14 = *(int *)((long)*round_offset + 0xc);
  auVar70 = ZEXT416((uint)shift);
  auVar64._0_4_ = (iVar55 + iVar71) - iVar11 >> auVar70;
  auVar64._4_4_ =
       ((int)((ulong)auVar62._0_8_ >> 0x20) + (int)((ulong)auVar72._0_8_ >> 0x20)) - iVar12 >>
       auVar70;
  auVar64._8_4_ = (auVar62._8_4_ + auVar72._8_4_) - iVar13 >> auVar70;
  auVar64._12_4_ = (auVar63._12_4_ + auVar73._12_4_) - iVar14 >> auVar70;
  iVar55 = CONCAT22(auVar66._8_2_,auVar54._8_2_ * auVar2._8_2_);
  auVar56._0_8_ = CONCAT26(auVar66._10_2_,CONCAT24(auVar54._10_2_ * auVar2._10_2_,iVar55));
  auVar56._8_2_ = auVar54._12_2_ * auVar2._12_2_;
  auVar56._10_2_ = auVar66._12_2_;
  auVar57._12_2_ = auVar54._14_2_ * auVar2._14_2_;
  auVar57._0_12_ = auVar56;
  auVar57._14_2_ = auVar66._14_2_;
  auVar34._0_4_ =
       (CONCAT22(auVar69._0_2_,auVar33._0_2_ * auVar61._0_2_) +
       CONCAT22(auVar68._0_2_,(short)alVar3[0] * auVar34._0_2_)) - iVar11 >> auVar70;
  auVar34._4_4_ = (auVar22._0_4_ + auVar21._0_4_) - iVar12 >> auVar70;
  auVar34._8_4_ =
       ((int)((unkuint10)Var26 >> 0x10) + (int)((unkuint10)Var25 >> 0x10)) - iVar13 >> auVar70;
  auVar34._12_4_ = (iVar29 + iVar28) - iVar14 >> auVar70;
  iVar28 = CONCAT22(auVar66._6_2_,sVar67);
  Var25 = CONCAT64(CONCAT42(iVar28,auVar66._4_2_),CONCAT22(auVar54._4_2_ * auVar2._4_2_,sVar67));
  auVar24._4_8_ = (long)((unkuint10)Var25 >> 0x10);
  auVar24._2_2_ = auVar66._2_2_;
  auVar24._0_2_ = auVar54._2_2_ * auVar2._2_2_;
  auVar34 = packssdw(auVar34,auVar64);
  auVar61._0_4_ = (iVar58 - iVar11) + iVar55 >> auVar70;
  auVar61._4_4_ =
       ((int)((ulong)auVar59._0_8_ >> 0x20) - iVar12) + (int)((ulong)auVar56._0_8_ >> 0x20) >>
       auVar70;
  auVar61._8_4_ = (auVar59._8_4_ - iVar13) + auVar56._8_4_ >> auVar70;
  auVar61._12_4_ = (auVar60._12_4_ - iVar14) + auVar57._12_4_ >> auVar70;
  auVar45._0_4_ =
       (CONCAT22(auVar65._0_2_,(short)alVar4[0] * auVar45._0_2_) - iVar11) +
       CONCAT22(auVar66._0_2_,auVar54._0_2_ * auVar2._0_2_) >> auVar70;
  auVar45._4_4_ = (auVar23._0_4_ - iVar12) + auVar24._0_4_ >> auVar70;
  auVar45._8_4_ =
       ((int)((unkuint10)Var27 >> 0x10) - iVar13) + (int)((unkuint10)Var25 >> 0x10) >> auVar70;
  auVar45._12_4_ = (iVar30 - iVar14) + iVar28 >> auVar70;
  auVar45 = packssdw(auVar45,auVar61);
  sVar67 = (short)(*clip_low)[0];
  sVar53 = *(short *)((long)*clip_low + 2);
  sVar5 = *(short *)((long)*clip_low + 4);
  sVar6 = *(short *)((long)*clip_low + 6);
  sVar7 = (short)(*clip_low)[1];
  sVar8 = *(short *)((long)*clip_low + 10);
  sVar9 = *(short *)((long)*clip_low + 0xc);
  sVar10 = *(short *)((long)*clip_low + 0xe);
  sVar32 = auVar34._0_2_;
  uVar31 = (ushort)(sVar32 < sVar67) * sVar67 | (ushort)(sVar32 >= sVar67) * sVar32;
  sVar32 = auVar34._2_2_;
  uVar35 = (ushort)(sVar32 < sVar53) * sVar53 | (ushort)(sVar32 >= sVar53) * sVar32;
  sVar32 = auVar34._4_2_;
  uVar36 = (ushort)(sVar32 < sVar5) * sVar5 | (ushort)(sVar32 >= sVar5) * sVar32;
  sVar32 = auVar34._6_2_;
  uVar37 = (ushort)(sVar32 < sVar6) * sVar6 | (ushort)(sVar32 >= sVar6) * sVar32;
  sVar32 = auVar34._8_2_;
  uVar38 = (ushort)(sVar32 < sVar7) * sVar7 | (ushort)(sVar32 >= sVar7) * sVar32;
  sVar32 = auVar34._10_2_;
  uVar39 = (ushort)(sVar32 < sVar8) * sVar8 | (ushort)(sVar32 >= sVar8) * sVar32;
  sVar32 = auVar34._12_2_;
  sVar42 = auVar34._14_2_;
  uVar40 = (ushort)(sVar32 < sVar9) * sVar9 | (ushort)(sVar32 >= sVar9) * sVar32;
  uVar41 = (ushort)(sVar42 < sVar10) * sVar10 | (ushort)(sVar42 >= sVar10) * sVar42;
  sVar32 = (short)(*clip_high)[0];
  sVar42 = *(short *)((long)*clip_high + 2);
  sVar15 = *(short *)((long)*clip_high + 4);
  sVar16 = *(short *)((long)*clip_high + 6);
  sVar17 = (short)(*clip_high)[1];
  sVar18 = *(short *)((long)*clip_high + 10);
  sVar19 = *(short *)((long)*clip_high + 0xc);
  sVar20 = *(short *)((long)*clip_high + 0xe);
  sVar44 = auVar45._0_2_;
  uVar43 = (ushort)(sVar44 < sVar67) * sVar67 | (ushort)(sVar44 >= sVar67) * sVar44;
  sVar67 = auVar45._2_2_;
  uVar46 = (ushort)(sVar67 < sVar53) * sVar53 | (ushort)(sVar67 >= sVar53) * sVar67;
  sVar67 = auVar45._4_2_;
  uVar47 = (ushort)(sVar67 < sVar5) * sVar5 | (ushort)(sVar67 >= sVar5) * sVar67;
  sVar67 = auVar45._6_2_;
  uVar48 = (ushort)(sVar67 < sVar6) * sVar6 | (ushort)(sVar67 >= sVar6) * sVar67;
  sVar67 = auVar45._8_2_;
  uVar49 = (ushort)(sVar67 < sVar7) * sVar7 | (ushort)(sVar67 >= sVar7) * sVar67;
  sVar67 = auVar45._10_2_;
  uVar50 = (ushort)(sVar67 < sVar8) * sVar8 | (ushort)(sVar67 >= sVar8) * sVar67;
  sVar67 = auVar45._12_2_;
  sVar53 = auVar45._14_2_;
  uVar51 = (ushort)(sVar67 < sVar9) * sVar9 | (ushort)(sVar67 >= sVar9) * sVar67;
  uVar52 = (ushort)(sVar53 < sVar10) * sVar10 | (ushort)(sVar53 >= sVar10) * sVar53;
  *dst = (ushort)(sVar32 < (short)uVar31) * sVar32 | (sVar32 >= (short)uVar31) * uVar31;
  dst[1] = (ushort)(sVar42 < (short)uVar35) * sVar42 | (sVar42 >= (short)uVar35) * uVar35;
  dst[2] = (ushort)(sVar15 < (short)uVar36) * sVar15 | (sVar15 >= (short)uVar36) * uVar36;
  dst[3] = (ushort)(sVar16 < (short)uVar37) * sVar16 | (sVar16 >= (short)uVar37) * uVar37;
  dst[4] = (ushort)(sVar17 < (short)uVar38) * sVar17 | (sVar17 >= (short)uVar38) * uVar38;
  dst[5] = (ushort)(sVar18 < (short)uVar39) * sVar18 | (sVar18 >= (short)uVar39) * uVar39;
  dst[6] = (ushort)(sVar19 < (short)uVar40) * sVar19 | (sVar19 >= (short)uVar40) * uVar40;
  dst[7] = (ushort)(sVar20 < (short)uVar41) * sVar20 | (sVar20 >= (short)uVar41) * uVar41;
  puVar1 = dst + dst_stride;
  *puVar1 = (ushort)(sVar32 < (short)uVar43) * sVar32 | (sVar32 >= (short)uVar43) * uVar43;
  puVar1[1] = (ushort)(sVar42 < (short)uVar46) * sVar42 | (sVar42 >= (short)uVar46) * uVar46;
  puVar1[2] = (ushort)(sVar15 < (short)uVar47) * sVar15 | (sVar15 >= (short)uVar47) * uVar47;
  puVar1[3] = (ushort)(sVar16 < (short)uVar48) * sVar16 | (sVar16 >= (short)uVar48) * uVar48;
  puVar1[4] = (ushort)(sVar17 < (short)uVar49) * sVar17 | (sVar17 >= (short)uVar49) * uVar49;
  puVar1[5] = (ushort)(sVar18 < (short)uVar50) * sVar18 | (sVar18 >= (short)uVar50) * uVar50;
  puVar1[6] = (ushort)(sVar19 < (short)uVar51) * sVar19 | (sVar19 >= (short)uVar51) * uVar51;
  puVar1[7] = (ushort)(sVar20 < (short)uVar52) * sVar20 | (sVar20 >= (short)uVar52) * uVar52;
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_w8_sse4_1(
    uint16_t *dst, int dst_stride, const CONV_BUF_TYPE *src0, int src0_stride,
    const CONV_BUF_TYPE *src1, int src1_stride, const __m128i *mask0a,
    const __m128i *mask0b, const __m128i *round_offset, int shift,
    const __m128i *clip_low, const __m128i *clip_high,
    const __m128i *max_mask) {
  // Load 8x pixels from each of 2 rows from each source
  const __m128i s0a = xx_loadu_128(src0);
  const __m128i s0b = xx_loadu_128(src0 + src0_stride);
  const __m128i s1a = xx_loadu_128(src1);
  const __m128i s1b = xx_loadu_128(src1 + src1_stride);

  // Generate inverse masks
  const __m128i mask1a = _mm_sub_epi16(*max_mask, *mask0a);
  const __m128i mask1b = _mm_sub_epi16(*max_mask, *mask0b);

  // Multiply sources by respective masks
  const __m128i mul0a_highs = _mm_mulhi_epu16(*mask0a, s0a);
  const __m128i mul0a_lows = _mm_mullo_epi16(*mask0a, s0a);
  const __m128i mul0ah = _mm_unpackhi_epi16(mul0a_lows, mul0a_highs);
  const __m128i mul0al = _mm_unpacklo_epi16(mul0a_lows, mul0a_highs);

  const __m128i mul1a_highs = _mm_mulhi_epu16(mask1a, s1a);
  const __m128i mul1a_lows = _mm_mullo_epi16(mask1a, s1a);
  const __m128i mul1ah = _mm_unpackhi_epi16(mul1a_lows, mul1a_highs);
  const __m128i mul1al = _mm_unpacklo_epi16(mul1a_lows, mul1a_highs);

  const __m128i sumah = _mm_add_epi32(mul0ah, mul1ah);
  const __m128i sumal = _mm_add_epi32(mul0al, mul1al);

  const __m128i mul0b_highs = _mm_mulhi_epu16(*mask0b, s0b);
  const __m128i mul0b_lows = _mm_mullo_epi16(*mask0b, s0b);
  const __m128i mul0bh = _mm_unpackhi_epi16(mul0b_lows, mul0b_highs);
  const __m128i mul0bl = _mm_unpacklo_epi16(mul0b_lows, mul0b_highs);

  const __m128i mul1b_highs = _mm_mulhi_epu16(mask1b, s1b);
  const __m128i mul1b_lows = _mm_mullo_epi16(mask1b, s1b);
  const __m128i mul1bh = _mm_unpackhi_epi16(mul1b_lows, mul1b_highs);
  const __m128i mul1bl = _mm_unpacklo_epi16(mul1b_lows, mul1b_highs);

  const __m128i sumbh = _mm_add_epi32(mul0bh, mul1bh);
  const __m128i sumbl = _mm_add_epi32(mul0bl, mul1bl);

  const __m128i roundah =
      _mm_srai_epi32(_mm_sub_epi32(sumah, *round_offset), shift);
  const __m128i roundal =
      _mm_srai_epi32(_mm_sub_epi32(sumal, *round_offset), shift);
  const __m128i roundbh =
      _mm_srai_epi32(_mm_sub_epi32(sumbh, *round_offset), shift);
  const __m128i roundbl =
      _mm_srai_epi32(_mm_sub_epi32(sumbl, *round_offset), shift);

  const __m128i packa = _mm_packs_epi32(roundal, roundah);
  const __m128i clipa =
      _mm_min_epi16(_mm_max_epi16(packa, *clip_low), *clip_high);
  const __m128i packb = _mm_packs_epi32(roundbl, roundbh);
  const __m128i clipb =
      _mm_min_epi16(_mm_max_epi16(packb, *clip_low), *clip_high);

  xx_storeu_128(dst, clipa);
  xx_storeu_128(dst + dst_stride, clipb);
}